

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_state_callback_clear(callback_type_e c_type)

{
  fio_ls_embd_s *pfVar1;
  fio_lock_i ret;
  
  if (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK)) {
    fio_lock(&callback_collection[c_type].lock);
    pfVar1 = callback_collection[c_type].callbacks.next;
    if (pfVar1 == (fio_ls_embd_s *)0x0) {
      pfVar1 = &callback_collection[c_type].callbacks;
      callback_collection[c_type].callbacks.prev = pfVar1;
      callback_collection[c_type].callbacks.next = pfVar1;
    }
    while (pfVar1 != &callback_collection[c_type].callbacks) {
      pfVar1 = fio_ls_embd_remove(pfVar1);
      free(pfVar1);
      pfVar1 = callback_collection[c_type].callbacks.next;
    }
    LOCK();
    callback_collection[c_type].lock = '\0';
    UNLOCK();
  }
  return;
}

Assistant:

void fio_state_callback_clear(callback_type_e c_type) {
  if ((int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return;
  fio_lock(&callback_collection[c_type].lock);
  fio_state_callback_ensure(&callback_collection[c_type]);
  while (fio_ls_embd_any(&callback_collection[c_type].callbacks)) {
    callback_data_s *tmp = FIO_LS_EMBD_OBJ(
        callback_data_s, node,
        fio_ls_embd_shift(&callback_collection[c_type].callbacks));
    free(tmp);
  }
  fio_unlock(&callback_collection[c_type].lock);
}